

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O2

int fiorfda(osfildef *fp,vocddef *p,uint cnt)

{
  ulong uVar1;
  vocddef *pvVar2;
  size_t sVar3;
  bool bVar4;
  uchar buf [14];
  
  pvVar2 = p;
  while (bVar4 = cnt != 0, cnt = cnt - 1, bVar4) {
    pvVar2->vocdfn = 0xffff;
    pvVar2 = pvVar2 + 1;
  }
  while( true ) {
    sVar3 = fread(buf,0xd,1,(FILE *)fp);
    if (sVar3 != 1) {
      return 1;
    }
    if (buf._0_2_ == -1) break;
    uVar1 = (ulong)(ushort)buf._0_2_;
    p[uVar1].vocdfn = buf._2_2_;
    p[uVar1].vocdarg.runstyp = buf[4];
    if (((buf[4] == '\r') || (buf[4] == '\x02')) || (buf[4] == '\n')) {
      p[uVar1].vocdarg.runsv.runsvobj = buf._5_2_;
    }
    else if (buf[4] == '\x01') {
      p[uVar1].vocdarg.runsv = (anon_union_8_4_1dda36f5_for_runsv)(long)(int)buf._5_4_;
    }
    p[uVar1].vocdprp = buf._9_2_;
    p[uVar1].vocdtim = (uint)(ushort)buf._11_2_;
  }
  return 0;
}

Assistant:

static int fiorfda(osfildef *fp, vocddef *p, uint cnt)
{
    vocddef *q;
    uint     i;
    uchar    buf[14];
    
    /* start by clearing out entire record */
    for (i = 0, q = p ; i < cnt ; ++q, ++i)
        q->vocdfn = MCMONINV;
    
    /* now restore all the records from the file */
    for (;;)
    {
        /* read a record, and quit if it's the last one */
        if (osfrb(fp, buf, 13)) return(TRUE);
        if ((i = osrp2(buf)) == 0xffff) return(FALSE);
        
        /* restore this record */
        q = p + i;
        q->vocdfn = osrp2(buf+2);
        q->vocdarg.runstyp = buf[4];
        switch(buf[4])
        {
        case DAT_NUMBER:
            q->vocdarg.runsv.runsvnum = osrp4s(buf+5);
            break;
        case DAT_OBJECT:
        case DAT_FNADDR:
            q->vocdarg.runsv.runsvobj = osrp2(buf+5);
            break;
        case DAT_PROPNUM:
            q->vocdarg.runsv.runsvprp = osrp2(buf+5);
            break;
        }
        q->vocdprp = osrp2(buf+9);
        q->vocdtim = osrp2(buf+11);
    }
}